

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

void __thiscall OpenSSLWrapper::SslContext::SslContext(SslContext *this,SSL_METHOD *sslMethod)

{
  SSL_CTX *pSVar1;
  
  this->_vptr_SslContext = (_func_int **)&PTR__SslContext_001459e0;
  pSVar1 = SSL_CTX_new((SSL_METHOD *)sslMethod);
  this->m_ctx = (SSL_CTX *)pSVar1;
  (this->m_strCertComName)._M_dataplus._M_p = (pointer)&(this->m_strCertComName).field_2;
  (this->m_strCertComName)._M_string_length = 0;
  (this->m_strCertComName).field_2._M_local_buf[0] = '\0';
  (this->m_vstrAltNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vstrAltNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vstrAltNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

SslContext::SslContext(const SSL_METHOD* sslMethod) noexcept : m_ctx(SSL_CTX_new(sslMethod))
    {
    }